

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

JavascriptError *
Js::JavascriptError::CreateFromCompileScriptException
          (ScriptContext *scriptContext,CompileScriptException *cse,WCHAR *sourceUrl)

{
  JavascriptError *instance;
  JavascriptString *pJVar1;
  Var pvVar2;
  Var value;
  JavascriptError *error;
  HRESULT hr;
  WCHAR *sourceUrl_local;
  CompileScriptException *cse_local;
  ScriptContext *scriptContext_local;
  
  instance = MapParseError(scriptContext,(cse->super_ScriptException).ei.scode);
  if ((cse->super_ScriptException).ei.bstrDescription != (BSTR)0x0) {
    pJVar1 = JavascriptString::NewCopySz
                       ((cse->super_ScriptException).ei.bstrDescription,scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0x102,pJVar1,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if ((cse->hasLineNumberInfo & 1U) != 0) {
    pvVar2 = JavascriptNumber::New((double)cse->line,scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0xf7,pvVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if ((cse->hasLineNumberInfo & 1U) != 0) {
    pvVar2 = JavascriptNumber::New
                       ((double)((cse->super_ScriptException).ichMin - cse->ichMinLine),
                        scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0x2d2,pvVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if ((cse->hasLineNumberInfo & 1U) != 0) {
    pvVar2 = JavascriptNumber::New
                       ((double)((cse->super_ScriptException).ichLim -
                                (cse->super_ScriptException).ichMin),scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0xd1,pvVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (cse->bstrLine != (BSTR)0x0) {
    pJVar1 = JavascriptString::NewCopySz(cse->bstrLine,scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0x153,pJVar1,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (sourceUrl != (WCHAR *)0x0) {
    pJVar1 = JavascriptString::NewCopySz(sourceUrl,scriptContext);
    Js::JavascriptOperators::OP_SetProperty
              (instance,0x2d3,pJVar1,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  return instance;
}

Assistant:

JavascriptError* JavascriptError::CreateFromCompileScriptException(ScriptContext* scriptContext, CompileScriptException* cse, const WCHAR * sourceUrl)
    {
        HRESULT hr = cse->ei.scode;
        Js::JavascriptError * error = Js::JavascriptError::MapParseError(scriptContext, hr);
        Var value;

        if (cse->ei.bstrDescription)
        {
            value = JavascriptString::NewCopySz(cse->ei.bstrDescription, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::message, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->line, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::line, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichMin - cse->ichMinLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::column, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichLim - cse->ichMin, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::length, value, scriptContext);
        }

        if (cse->bstrLine != nullptr)
        {
            value = JavascriptString::NewCopySz(cse->bstrLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::source, value, scriptContext);
        }

        if (sourceUrl != nullptr)
        {
            value = JavascriptString::NewCopySz(sourceUrl, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::url, value, scriptContext);
        }

        return error;
    }